

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

void Bac_NtkUpdateFanout(Bac_Ntk_t *p,int iOld,int iNew)

{
  int iVar1;
  int iVar2;
  
  iVar1 = Bac_ObjIsCi(p,iOld);
  if (iVar1 == 0) {
    __assert_fail("Bac_ObjIsCi(p, iOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0xda,"void Bac_NtkUpdateFanout(Bac_Ntk_t *, int, int)");
  }
  iVar1 = Bac_ObjIsCi(p,iNew);
  if (iVar1 == 0) {
    __assert_fail("Bac_ObjIsCi(p, iNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0xdb,"void Bac_NtkUpdateFanout(Bac_Ntk_t *, int, int)");
  }
  iVar1 = Bac_ObjFanout(p,iOld);
  while( true ) {
    if (iVar1 == 0) {
      iVar1 = Bac_ObjFanout(p,iOld);
      Bac_ObjSetFanout(p,iNew,iVar1);
      Bac_ObjSetFanout(p,iOld,0);
      return;
    }
    iVar2 = Bac_ObjFanin(p,iVar1);
    if (iVar2 != iOld) {
      __assert_fail("Bac_ObjFanin(p, iCo) == iOld",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                    ,0xde,"void Bac_NtkUpdateFanout(Bac_Ntk_t *, int, int)");
    }
    iVar2 = Bac_ObjFanin(p,iVar1);
    if (iVar2 < 0) break;
    iVar2 = Bac_ObjIsCo(p,iVar1);
    if (iVar2 == 0) break;
    Vec_IntSetEntry(&p->vFanin,iVar1,-1);
    Bac_ObjSetFanin(p,iVar1,iNew);
    iVar1 = Bac_ObjNextFanout(p,iVar1);
  }
  __assert_fail("Bac_ObjFanin(p, i) >= 0 && Bac_ObjIsCo(p, i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                ,0x129,"void Bac_ObjCleanFanin(Bac_Ntk_t *, int)");
}

Assistant:

void Bac_NtkUpdateFanout( Bac_Ntk_t * p, int iOld, int iNew )
{
    int iCo;
    assert( Bac_ObjIsCi(p, iOld) );
    assert( Bac_ObjIsCi(p, iNew) );
    Bac_ObjForEachFanout( p, iOld, iCo )
    {
        assert( Bac_ObjFanin(p, iCo) == iOld );
        Bac_ObjCleanFanin( p, iCo );
        Bac_ObjSetFanin( p, iCo, iNew );
    }
    Bac_ObjSetFanout( p, iNew, Bac_ObjFanout(p, iOld) );
    Bac_ObjSetFanout( p, iOld, 0 );
}